

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<int,unsigned_long>(void)

{
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  bool bVar1;
  uint in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffd0;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffd4;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  undefined4 local_24;
  int local_18;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  int local_10;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_c;
  int local_8;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  
  local_8 = 3;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_4,&local_8);
  bVar1 = ::operator!=(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffd4);
  in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 & 0xffffff;
  if (bVar1) {
    local_10 = 4;
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_c,&local_10);
    bVar1 = ::operator!=(in_stack_ffffffffffffffd4,
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 & 0xffffff;
    if (bVar1) {
      local_18 = 6;
      SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                (&local_14,&local_18);
      local_24 = 7;
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(in_stack_ffffffffffffffd4.m_int,in_stack_ffffffffffffffd0.m_int),
                 (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      rhs.m_int._4_4_ = in_stack_ffffffffffffffcc;
      rhs.m_int._0_4_ = in_stack_ffffffffffffffc8;
      bVar1 = ::operator!=(in_stack_ffffffffffffffd4,rhs);
      in_stack_ffffffffffffffc8 = 0;
      if (bVar1) {
        SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                  (&local_28,(int *)&stack0xffffffffffffffd4);
        bVar1 = ::operator!=(false,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                                    )0x0);
        in_stack_ffffffffffffffc8 = 0;
        if (bVar1) {
          SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                    ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &stack0xffffffffffffffd0,(int *)&stack0xffffffffffffffcc);
          bVar1 = ::operator!=(false,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                                      )0x0);
          in_stack_ffffffffffffffc8 = (uint)bVar1 << 0x18;
        }
      }
    }
  }
  return SUB41(in_stack_ffffffffffffffc8 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}